

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_QuicLegacyCodepointDisabled_Test::TestBody
          (QUICMethodTest_QuicLegacyCodepointDisabled_Test *this)

{
  internal iVar1;
  int iVar2;
  size_t in_RCX;
  char *in_R9;
  pointer *__ptr;
  Span<const_unsigned_char> expected;
  Span<const_unsigned_char> expected_00;
  AssertionResult gtest_ar_;
  uint8_t kServerParams [3];
  uint8_t kClientParams [4];
  SSL_QUIC_METHOD quic_method;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined1 local_6c [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_44 [12];
  code *local_38;
  code *local_30;
  code *local_28;
  code *local_20;
  
  local_44._4_8_ = QUICMethodTest::SetReadSecretCallback;
  local_38 = QUICMethodTest::SetWriteSecretCallback;
  local_30 = QUICMethodTest::AddHandshakeDataCallback;
  local_28 = QUICMethodTest::FlushFlightCallback;
  local_20 = QUICMethodTest::SendAlertCallback;
  iVar2 = SSL_CTX_set_quic_method
                    ((this->super_QUICMethodTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (SSL_QUIC_METHOD *)(local_44 + 4));
  local_80[0] = (internal)(iVar2 != 0);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(local_6c + 4),local_80,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1fd8,(char *)local_6c._4_8_);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
  }
  else {
    iVar2 = SSL_CTX_set_quic_method
                      ((this->super_QUICMethodTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (SSL_QUIC_METHOD *)(local_44 + 4));
    local_80[0] = (internal)(iVar2 != 0);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)(local_6c + 4),local_80,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1fd9,(char *)local_6c._4_8_);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    }
    else {
      iVar1 = (internal)QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_80[0] = iVar1;
      if (!(bool)iVar1) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(local_6c + 4),local_80,(AssertionResult *)"CreateClientAndServer()",
                   "false","true",in_R9);
        in_RCX = 0x1fdb;
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1fdb,(char *)local_6c._4_8_);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c._4_8_ != &local_58) {
          operator_delete((void *)local_6c._4_8_,local_58._M_allocated_capacity + 1);
        }
        if (local_90._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_90._M_head_impl + 8))();
        }
        if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78);
        }
        if (!(bool)iVar1) {
          return;
        }
      }
      local_44._0_4_ = 0x4030201;
      local_6c[2] = 7;
      local_6c._0_2_ = 0x605;
      SSL_set_quic_use_legacy_codepoint
                ((this->super_QUICMethodTest).client_._M_t.
                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
      SSL_set_quic_use_legacy_codepoint
                ((this->super_QUICMethodTest).server_._M_t.
                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,0);
      iVar2 = SSL_set_quic_transport_params
                        ((this->super_QUICMethodTest).client_._M_t.
                         super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_44,4);
      local_80[0] = (internal)(iVar2 != 0);
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(local_6c + 4),local_80,
                   (AssertionResult *)
                   "SSL_set_quic_transport_params(client_.get(), kClientParams, sizeof(kClientParams))"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1fe1,(char *)local_6c._4_8_);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      }
      else {
        iVar2 = SSL_set_quic_transport_params
                          ((this->super_QUICMethodTest).server_._M_t.
                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,local_6c,3);
        local_80[0] = (internal)(iVar2 != 0);
        local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_80[0]) {
          iVar1 = (internal)
                  QUICMethodTest::RunQUICHandshakesAndExpectError
                            (&this->super_QUICMethodTest,kNoError);
          local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_80[0] = iVar1;
          if (!(bool)iVar1) {
            testing::Message::Message((Message *)&local_90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)(local_6c + 4),local_80,
                       (AssertionResult *)"CompleteHandshakesForQUIC()","false","true",in_R9);
            in_RCX = 0x1fe5;
            testing::internal::AssertHelper::AssertHelper
                      (&local_88,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1fe5,(char *)local_6c._4_8_);
            testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
            testing::internal::AssertHelper::~AssertHelper(&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6c._4_8_ != &local_58) {
              operator_delete((void *)local_6c._4_8_,local_58._M_allocated_capacity + 1);
            }
            if (local_90._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_90._M_head_impl + 8))();
            }
            if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_78,local_78);
            }
            if (!(bool)iVar1) {
              return;
            }
          }
          expected.size_ = in_RCX;
          expected.data_ = (uchar *)0x3;
          ExpectReceivedTransportParamsEqual
                    ((anon_unknown_0 *)
                     (this->super_QUICMethodTest).client_._M_t.
                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(SSL *)local_6c,expected);
          expected_00.size_ = in_RCX;
          expected_00.data_ = &DAT_00000004;
          ExpectReceivedTransportParamsEqual
                    ((anon_unknown_0 *)
                     (this->super_QUICMethodTest).server_._M_t.
                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,(SSL *)local_44,expected_00
                    );
          return;
        }
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(local_6c + 4),local_80,
                   (AssertionResult *)
                   "SSL_set_quic_transport_params(server_.get(), kServerParams, sizeof(kServerParams))"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1fe3,(char *)local_6c._4_8_);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c._4_8_ != &local_58) {
    operator_delete((void *)local_6c._4_8_,local_58._M_allocated_capacity + 1);
  }
  if (local_90._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_90._M_head_impl + 8))();
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, QuicLegacyCodepointDisabled) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));

  ASSERT_TRUE(CreateClientAndServer());
  uint8_t kClientParams[] = {1, 2, 3, 4};
  uint8_t kServerParams[] = {5, 6, 7};
  SSL_set_quic_use_legacy_codepoint(client_.get(), 0);
  SSL_set_quic_use_legacy_codepoint(server_.get(), 0);
  ASSERT_TRUE(SSL_set_quic_transport_params(client_.get(), kClientParams,
                                            sizeof(kClientParams)));
  ASSERT_TRUE(SSL_set_quic_transport_params(server_.get(), kServerParams,
                                            sizeof(kServerParams)));

  ASSERT_TRUE(CompleteHandshakesForQUIC());
  ExpectReceivedTransportParamsEqual(client_.get(), kServerParams);
  ExpectReceivedTransportParamsEqual(server_.get(), kClientParams);
}